

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold_effectiveness.cpp
# Opt level: O2

void run<ANSfold<8u>>(vector<unsigned_int,_std::allocator<unsigned_int>_> *input,string *input_name)

{
  uint32_t *src;
  pointer puVar1;
  pointer puVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  size_t unaff_R14;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar5 [16];
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var [56];
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp_buf;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  undefined8 local_50 [4];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  compute_entropy(input);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
             ((long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                    .super__Vector_impl_data._M_finish -
             (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start) * 2,(allocator_type *)local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,
             ((long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                    .super__Vector_impl_data._M_finish -
             (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start) * 2,(allocator_type *)local_50);
  bVar4 = true;
  while (auVar5 = in_ZMM1._0_16_, bVar4) {
    std::chrono::_V2::system_clock::now();
    src = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start;
    unaff_R14 = ans_fold_compress<8u>
                          (local_68._M_impl.super__Vector_impl_data._M_start,
                           (long)local_68._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_68._M_impl.super__Vector_impl_data._M_start,src,
                           (long)(input->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)src >> 2);
    std::chrono::_V2::system_clock::now();
    in_ZMM1._8_56_ = extraout_var;
    in_ZMM1._0_8_ = extraout_XMM1_Qa;
    bVar4 = false;
  }
  puVar1 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  ANSfold<8u>::name_abi_cxx11_();
  auVar3 = vcvtusi2sd_avx512f(auVar5,(long)puVar2 - (long)puVar1 >> 2);
  auVar5 = vcvtusi2sd_avx512f(auVar5,unaff_R14 << 3);
  printf("(%s,%2.4f)\n",auVar5._0_8_ / auVar3._0_8_,local_50[0]);
  std::__cxx11::string::~string((string *)local_50);
  fflush(_stdout);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void run(std::vector<uint32_t>& input, std::string input_name)
{
    // (0) compute entropy
    auto [input_entropy, sigma] = compute_entropy(input);

    // (1) encode
    std::vector<uint8_t> encoded_data(input.size() * 8);
    std::vector<uint8_t> tmp_buf(input.size() * 8);

    size_t encoded_bytes;
    size_t encoding_time_ns_min = std::numeric_limits<size_t>::max();
    for (int i = 0; i < NUM_RUNS; i++) {
        auto start_encode = std::chrono::high_resolution_clock::now();
        encoded_bytes = t_compressor::encode(input.data(), input.size(),
            encoded_data.data(), encoded_data.size(), tmp_buf.data());
        auto stop_encode = std::chrono::high_resolution_clock::now();
        auto encoding_time_ns = stop_encode - start_encode;
        encoding_time_ns_min
            = std::min((size_t)encoding_time_ns.count(), encoding_time_ns_min);
    }

    double BPI = double(encoded_bytes * 8) / double(input.size());
    double encode_IPS = compute_ips(input.size(), encoding_time_ns_min);
    double enc_ns_per_int = double(encoding_time_ns_min) / double(input.size());

    // (4) output stats
    printf("(%s,%2.4f)\n", t_compressor::name().c_str(), BPI);
    fflush(stdout);
}